

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

void world_timed_save(void *world_void)

{
  undefined8 *puVar1;
  bool bVar2;
  mapped_type *this;
  undefined8 *puVar3;
  key_type local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TimedSave","");
  this = std::__detail::
         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)((long)world_void + 0x198),&local_40);
  bVar2 = util::variant::GetBool(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    puVar1 = *(undefined8 **)((long)world_void + 0x468);
    for (puVar3 = *(undefined8 **)((long)world_void + 0x460); puVar3 != puVar1; puVar3 = puVar3 + 1)
    {
      Character::Save((Character *)*puVar3);
    }
    GuildManager::SaveAll(*(GuildManager **)((long)world_void + 0x158));
    bVar2 = Database::Pending((Database *)((long)world_void + 0x88));
    if (bVar2) {
      Database::Commit((Database *)((long)world_void + 0x88));
    }
    World::BeginDB((World *)world_void);
  }
  return;
}

Assistant:

void world_timed_save(void *world_void)
{
	World *world = static_cast<World *>(world_void);

	if (!world->config["TimedSave"])
		return;

	UTIL_FOREACH(world->characters, character)
	{
		character->Save();
	}

	world->guildmanager->SaveAll();

	try
	{
		world->CommitDB();
	}
	catch (Database_Exception& e)
	{
		Console::Wrn("Database commit failed - no data was saved!");
		world->db.Rollback();
	}

	world->BeginDB();
}